

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLCOUNTERATTACK_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000338;
  double *in_stack_00000340;
  double *in_stack_00000348;
  double *in_stack_00000350;
  int in_stack_0000035c;
  int in_stack_00000360;
  int *in_stack_00000370;
  int *in_stack_00000378;
  int *in_stack_00000380;
  
  TVar1 = TA_CDLCOUNTERATTACK(in_stack_00000360,in_stack_0000035c,in_stack_00000350,
                              in_stack_00000348,in_stack_00000340,in_stack_00000338,
                              in_stack_00000370,in_stack_00000378,in_stack_00000380);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLCOUNTERATTACK_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLCOUNTERATTACK(
/* Generated */                          startIdx,
/* Generated */                          endIdx,
/* Generated */                          params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                          params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                          params->in[0].data.inPrice.low, /* inLow */
/* Generated */                          params->in[0].data.inPrice.close, /* inClose */
/* Generated */                          outBegIdx, 
/* Generated */                          outNBElement, 
/* Generated */                          params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }